

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

int32_t decUnitCompare(uint8_t *a,int32_t alength,uint8_t *b,int32_t blength,int32_t exp)

{
  int32_t iVar1;
  bool bVar2;
  uint local_dc;
  uint local_d4;
  uint local_c8;
  uint local_bc;
  int32_t result;
  int32_t exprem;
  int32_t expunits;
  uint8_t *u;
  uint8_t *r;
  uint8_t *l;
  int32_t need;
  int32_t accunits;
  uint8_t *allocacc;
  uint8_t accbuff [73];
  uint8_t *acc;
  int32_t exp_local;
  int32_t blength_local;
  uint8_t *b_local;
  int32_t alength_local;
  uint8_t *a_local;
  
  _need = (uint8_t **)0x0;
  if (exp == 0) {
    if (blength < alength) {
      a_local._4_4_ = 1;
    }
    else if (alength < blength) {
      a_local._4_4_ = 0xffffffff;
    }
    else {
      r = a + alength;
      u = b + alength;
      do {
        r = r + -1;
        u = u + -1;
        if (r < a) {
          return 0;
        }
        if (*u < *r) {
          return 1;
        }
      } while (*u <= *r);
      a_local._4_4_ = 0xffffffff;
    }
  }
  else {
    if (exp < 0x32) {
      local_c8 = (uint)""[exp];
    }
    else {
      local_c8 = exp / 1;
    }
    if ((int)(blength + local_c8) < alength) {
      a_local._4_4_ = 1;
    }
    else {
      if (exp < 0x32) {
        local_d4 = (uint)""[exp];
      }
      else {
        local_d4 = exp / 1;
      }
      if (alength + 1 < (int)(blength + local_d4)) {
        a_local._4_4_ = 0xffffffff;
      }
      else {
        if (exp < 0x32) {
          local_dc = (uint)""[exp];
        }
        else {
          local_dc = exp / 1;
        }
        l._0_4_ = blength + local_dc;
        if ((int32_t)l < alength) {
          l._0_4_ = alength;
        }
        unique0x00004780 = &allocacc;
        if (((int32_t)l + 2U < 0x4a) ||
           (_need = (uint8_t **)uprv_malloc_63((long)(int)((int32_t)l + 2U)),
           unique0x10000143 = _need, _need != (uint8_t **)0x0)) {
          iVar1 = decUnitAddSub(a,alength,b,blength,exp / 1,(uint8_t *)stack0xffffffffffffffc8,
                                -DECPOWERS[exp % 1]);
          if (iVar1 < 0) {
            local_bc = 0xffffffff;
          }
          else {
            _exprem = stack0xffffffffffffffc8;
            while( true ) {
              bVar2 = false;
              if (_exprem < (uint8_t **)((long)stack0xffffffffffffffc8 + (long)iVar1 + -1)) {
                bVar2 = *(char *)_exprem == '\0';
              }
              if (!bVar2) break;
              _exprem = (uint8_t **)((long)_exprem + 1);
            }
            local_bc = (uint)(*(char *)_exprem != '\0');
          }
          if (_need != (uint8_t **)0x0) {
            uprv_free_63(_need);
          }
          a_local._4_4_ = local_bc;
        }
        else {
          a_local._4_4_ = 0x80000000;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static Int decUnitCompare(const Unit *a, Int alength,
                          const Unit *b, Int blength, Int exp) {
  Unit  *acc;                      /* accumulator for result  */
  Unit  accbuff[SD2U(DECBUFFER*2+1)]; /* local buffer  */
  Unit  *allocacc=NULL;            /* -> allocated acc buffer, iff allocated  */
  Int   accunits, need;            /* units in use or needed for acc  */
  const Unit *l, *r, *u;           /* work  */
  Int   expunits, exprem, result;  /* ..  */

  if (exp==0) {                    /* aligned; fastpath  */
    if (alength>blength) return 1;
    if (alength<blength) return -1;
    /* same number of units in both -- need unit-by-unit compare  */
    l=a+alength-1;
    r=b+alength-1;
    for (;l>=a; l--, r--) {
      if (*l>*r) return 1;
      if (*l<*r) return -1;
      }
    return 0;                      /* all units match  */
    } /* aligned  */

  /* Unaligned.  If one is >1 unit longer than the other, padded  */
  /* approximately, then can return easily  */
  if (alength>blength+(Int)D2U(exp)) return 1;
  if (alength+1<blength+(Int)D2U(exp)) return -1;

  /* Need to do a real subtract.  For this, a result buffer is needed  */
  /* even though only the sign is of interest.  Its length needs  */
  /* to be the larger of alength and padded blength, +2  */
  need=blength+D2U(exp);                /* maximum real length of B  */
  if (need<alength) need=alength;
  need+=2;
  acc=accbuff;                          /* assume use local buffer  */
  if (need*sizeof(Unit)>sizeof(accbuff)) {
    allocacc=(Unit *)malloc(need*sizeof(Unit));
    if (allocacc==NULL) return BADINT;  /* hopeless -- abandon  */
    acc=allocacc;
    }
  /* Calculate units and remainder from exponent.  */
  expunits=exp/DECDPUN;
  exprem=exp%DECDPUN;
  /* subtract [A+B*(-m)]  */
  accunits=decUnitAddSub(a, alength, b, blength, expunits, acc,
                         -(Int)powers[exprem]);
  /* [UnitAddSub result may have leading zeros, even on zero]  */
  if (accunits<0) result=-1;            /* negative result  */
   else {                               /* non-negative result  */
    /* check units of the result before freeing any storage  */
    for (u=acc; u<acc+accunits-1 && *u==0;) u++;
    result=(*u==0 ? 0 : +1);
    }
  /* clean up and return the result  */
  if (allocacc!=NULL) free(allocacc);   /* drop any storage used  */
  return result;
  }